

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O3

Trivia __thiscall
slang::parsing::Preprocessor::handleDefaultNetTypeDirective(Preprocessor *this,Token directive)

{
  Token *pTVar1;
  undefined2 uVar2;
  undefined2 uVar3;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  Info *pIVar4;
  undefined4 uVar9;
  undefined4 uVar10;
  uint uVar11;
  undefined1 uVar12;
  NumericTokenFlags NVar13;
  uint32_t uVar14;
  Token TVar15;
  SourceLocation SVar16;
  DefaultNetTypeDirectiveSyntax *syntax;
  uint uVar17;
  Token TVar18;
  string_view sVar19;
  Token local_68;
  Token local_58;
  Token local_48;
  Trivia local_38;
  
  local_58.info = directive.info;
  local_58._0_8_ = directive._0_8_;
  checkOutsideDesignElement(this,directive);
  Token::Token(&local_68);
  pTVar1 = &this->currentToken;
  pIVar4 = (this->currentToken).info;
  if (pIVar4 == (Info *)0x0) {
    TVar18 = nextProcessed(this);
    this->currentToken = TVar18;
  }
  else {
    uVar2 = pTVar1->kind;
    uVar5 = pTVar1->field_0x2;
    uVar7 = pTVar1->numFlags;
    uVar9 = pTVar1->rawLen;
    TVar18.rawLen = uVar9;
    TVar18.numFlags.raw = uVar7;
    TVar18._2_1_ = uVar5;
    TVar18.kind = uVar2;
    TVar18.info = pIVar4;
  }
  uVar11 = TVar18._0_4_ & 0xffff;
  uVar17 = uVar11 - 0x132;
  if ((uVar17 < 0x21) && ((0x12081003fU >> ((ulong)uVar17 & 0x3f) & 1) != 0)) {
    if (TVar18.info == (Info *)0x0) {
      TVar18 = nextProcessed(this);
      this->currentToken = TVar18;
    }
    uVar12 = pTVar1->field_0x2;
    NVar13.raw = (pTVar1->numFlags).raw;
    uVar14 = pTVar1->rawLen;
    pIVar4 = (this->currentToken).info;
    (this->lastConsumed).kind = pTVar1->kind;
    (this->lastConsumed).field_0x2 = uVar12;
    (this->lastConsumed).numFlags = (NumericTokenFlags)NVar13.raw;
    (this->lastConsumed).rawLen = uVar14;
    (this->lastConsumed).info = pIVar4;
    Token::Token(&local_48);
    TVar15 = local_48;
    pTVar1->kind = local_48.kind;
    pTVar1->field_0x2 = local_48._2_1_;
    pTVar1->numFlags = (NumericTokenFlags)local_48.numFlags.raw;
    pTVar1->rawLen = local_48.rawLen;
    (this->currentToken).info = local_48.info;
    this->defaultNetType = TVar18.kind;
    local_68 = TVar18;
    local_48 = TVar15;
  }
  else if (uVar11 == 2) {
    if (TVar18.info == (Info *)0x0) {
      TVar18 = nextProcessed(this);
      this->currentToken = TVar18;
    }
    local_48 = TVar18;
    sVar19 = Token::rawText(&local_48);
    if ((sVar19._M_len == 4) && (*(int *)sVar19._M_str == 0x656e6f6e)) {
      pIVar4 = (this->currentToken).info;
      if (pIVar4 == (Info *)0x0) {
        local_68 = nextProcessed(this);
        this->currentToken = local_68;
      }
      else {
        uVar3 = pTVar1->kind;
        uVar6 = pTVar1->field_0x2;
        uVar8 = pTVar1->numFlags;
        uVar10 = pTVar1->rawLen;
        local_68.rawLen = uVar10;
        local_68.numFlags.raw = uVar8;
        local_68._2_1_ = uVar6;
        local_68.kind = uVar3;
        local_68.info = pIVar4;
      }
      uVar12 = pTVar1->field_0x2;
      NVar13.raw = (pTVar1->numFlags).raw;
      uVar14 = pTVar1->rawLen;
      pIVar4 = (this->currentToken).info;
      (this->lastConsumed).kind = pTVar1->kind;
      (this->lastConsumed).field_0x2 = uVar12;
      (this->lastConsumed).numFlags = (NumericTokenFlags)NVar13.raw;
      (this->lastConsumed).rawLen = uVar14;
      (this->lastConsumed).info = pIVar4;
      Token::Token(&local_48);
      TVar18 = local_48;
      pTVar1->kind = local_48.kind;
      pTVar1->field_0x2 = local_48._2_1_;
      pTVar1->numFlags = (NumericTokenFlags)local_48.numFlags.raw;
      pTVar1->rawLen = local_48.rawLen;
      (this->currentToken).info = local_48.info;
      this->defaultNetType = Unknown;
      local_48 = TVar18;
    }
  }
  if (local_68.info == (Info *)0x0) {
    SVar16 = Token::location(&local_58);
    sVar19 = Token::rawText(&local_58);
    SVar16 = (SourceLocation)((long)SVar16 + sVar19._M_len * 0x10000000);
    Diagnostics::add(this->diagnostics,(DiagCode)0x70004,SVar16);
    local_68 = Token::createMissing(this->alloc,WireKeyword,SVar16);
  }
  syntax = BumpAllocator::
           emplace<slang::syntax::DefaultNetTypeDirectiveSyntax,slang::parsing::Token&,slang::parsing::Token&>
                     (this->alloc,&local_58,&local_68);
  Trivia::Trivia(&local_38,Directive,(SyntaxNode *)syntax);
  return local_38;
}

Assistant:

Trivia Preprocessor::handleDefaultNetTypeDirective(Token directive) {
    checkOutsideDesignElement(directive);

    Token netType;
    switch (peek().kind) {
        case TokenKind::WireKeyword:
        case TokenKind::UWireKeyword:
        case TokenKind::WAndKeyword:
        case TokenKind::WOrKeyword:
        case TokenKind::TriKeyword:
        case TokenKind::Tri0Keyword:
        case TokenKind::Tri1Keyword:
        case TokenKind::TriAndKeyword:
        case TokenKind::TriOrKeyword:
        case TokenKind::TriRegKeyword:
            netType = consume();
            defaultNetType = netType.kind;
            break;
        case TokenKind::Identifier:
            // none isn't a keyword but it's special here
            if (peek().rawText() == "none") {
                netType = consume();
                defaultNetType = TokenKind::Unknown;
            }
            break;
        default:
            break;
    }

    if (!netType) {
        auto loc = directive.location() + directive.rawText().length();
        addDiag(diag::ExpectedNetType, loc);
        netType = Token::createMissing(alloc, TokenKind::WireKeyword, loc);
    }

    auto result = alloc.emplace<DefaultNetTypeDirectiveSyntax>(directive, netType);
    return Trivia(TriviaKind::Directive, result);
}